

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * vkt::shaderexecutor::ContainerTraits<tcu::Vector<int,_2>,_tcu::Vector<tcu::Interval,_2>_>::
       doRound(IVal *__return_storage_ptr__,FloatFormat *fmt,Vector<int,_2> *value)

{
  Vector<int,_2> *fmt_00;
  int *value_00;
  Interval *pIVar1;
  IVal local_40;
  int local_24;
  Vector<int,_2> *pVStack_20;
  int ndx;
  Vector<int,_2> *value_local;
  FloatFormat *fmt_local;
  IVal *ret;
  
  pVStack_20 = value;
  value_local = (Vector<int,_2> *)fmt;
  fmt_local = (FloatFormat *)__return_storage_ptr__;
  tcu::Vector<tcu::Interval,_2>::Vector(__return_storage_ptr__);
  for (local_24 = 0; fmt_00 = value_local, local_24 < 2; local_24 = local_24 + 1) {
    value_00 = tcu::Vector<int,_2>::operator[](value,local_24);
    round<int>(&local_40,(FloatFormat *)fmt_00,value_00);
    pIVar1 = tcu::Vector<tcu::Interval,_2>::operator[](__return_storage_ptr__,local_24);
    pIVar1->m_hasNaN = local_40.m_hasNaN;
    *(undefined7 *)&pIVar1->field_0x1 = local_40._1_7_;
    pIVar1->m_lo = local_40.m_lo;
    pIVar1->m_hi = local_40.m_hi;
  }
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}